

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_draw.c
# Opt level: O2

void swap_drawstring(char *str,guint8 *im,size_t w,size_t h)

{
  ulong uVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  bmap_t *bm;
  guint8 gVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  guint8 *pgVar10;
  guint8 *pgVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  uint h_00;
  bool bVar15;
  undefined1 auVar16 [12];
  int local_a8;
  FT_Face_conflict face;
  ulong local_98;
  long local_90;
  int local_88;
  int local_84;
  FT_Bitmap *local_80;
  ulong local_78;
  long local_70;
  FT_GlyphSlot_conflict local_68;
  guint8 *local_60;
  long local_58;
  FT_Library lib;
  ulong local_48;
  long local_40;
  size_t local_38;
  
  uVar14 = 8;
  if (8 < h >> 6) {
    uVar14 = h >> 6;
  }
  uVar7 = (h >> 5) + 3;
  uVar9 = 0x14;
  if (0x21f < h) {
    uVar9 = uVar7 & 0xfffffffc;
  }
  uVar1 = 0x10;
  if (h < 0x440) {
    uVar1 = uVar14;
  }
  uVar14 = uVar1 & 0xffffffff;
  if ((str != (char *)0x0) && (local_60 = im, iVar2 = FT_Init_FreeType(&lib), iVar2 == 0)) {
    iVar2 = FT_New_Face(lib,"/usr/local/lib/data/DroidSans-Bold.ttf",0,&face);
    if (iVar2 == 0) {
      if (0x20 < (uVar7 & 0xfffffffffffffffc)) {
        uVar9 = 0x20;
      }
      iVar2 = FT_Set_Pixel_Sizes(face,0,uVar9);
      if (iVar2 == 0) {
        iVar2 = ((int)h - (int)uVar1) + -3;
        local_68 = face->glyph;
        local_38 = strlen(str);
        local_a8 = (int)w;
        local_70 = (long)(int)h;
        for (sVar8 = 0; sVar8 != local_38; sVar8 = sVar8 + 1) {
          uVar3 = FT_Get_Char_Index(face,(long)str[sVar8]);
          iVar4 = FT_Load_Glyph(face,uVar3,0);
          if ((iVar4 == 0) && (iVar4 = FT_Get_Glyph(local_68,&local_58), iVar4 == 0)) {
            local_90 = local_58;
            iVar4 = FT_Glyph_To_Bitmap(&local_90,1,0,0);
            iVar13 = (int)uVar14;
            if (iVar4 == 0) {
              if ((*(char *)(local_90 + 0x4a) == '\x02') && (*(short *)(local_90 + 0x48) == 0x100))
              {
                local_80 = (FT_Bitmap *)(local_90 + 0x30);
                local_98 = (ulong)*(uint *)(local_90 + 0x28);
                local_78 = (ulong)(uint)(iVar2 - *(int *)(local_90 + 0x2c));
                local_88 = *(uint *)(local_90 + 0x28) + iVar13 + -1;
                uVar5 = *(int *)(local_90 + 0x34) + 4;
                h_00 = *(int *)(local_90 + 0x30) + 4;
                local_84 = iVar2;
                bm = (bmap_t *)g_malloc(0x10);
                auVar16 = g_malloc((long)(int)(h_00 * uVar5));
                pgVar10 = auVar16._0_8_;
                bm->b = pgVar10;
                bm->w = uVar5;
                bm->h = h_00;
                ft2bmap(local_80,bm,auVar16._8_4_);
                blur(pgVar10,uVar5,h_00);
                blur(pgVar10,uVar5,h_00);
                local_40 = (long)((int)local_98 + iVar13);
                local_98 = (ulong)((int)local_78 + 1);
                iVar2 = 0;
                uVar14 = 0;
                if (0 < (int)h_00) {
                  uVar14 = (ulong)h_00;
                }
                local_48 = 0;
                if (0 < (int)uVar5) {
                  local_48 = (ulong)uVar5;
                }
                pgVar11 = local_60 + w * local_98;
                for (uVar7 = 0; uVar7 != uVar14; uVar7 = uVar7 + 1) {
                  if (-1 < (long)(uVar7 + local_98)) {
                    uVar9 = local_48;
                    lVar12 = local_40;
                    iVar4 = iVar2;
                    if (local_70 <= (long)(uVar7 + local_98)) break;
                    while (uVar9 != 0) {
                      if (-1 < lVar12) {
                        if (local_a8 <= lVar12) break;
                        gVar6 = (guint8)((uint)pgVar11[lVar12] - (uint)pgVar10[iVar4]);
                        if ((int)((uint)pgVar11[lVar12] - (uint)pgVar10[iVar4]) < 1) {
                          gVar6 = '\0';
                        }
                        pgVar11[lVar12] = gVar6;
                      }
                      uVar9 = uVar9 - 1;
                      lVar12 = lVar12 + 1;
                      iVar4 = iVar4 + 1;
                    }
                  }
                  iVar2 = iVar2 + uVar5;
                  pgVar11 = pgVar11 + w;
                }
                ft2bmap(local_80,bm,iVar2);
                blur(pgVar10,uVar5,h_00);
                uVar14 = (ulong)(uint)bm->h;
                if (bm->h < 1) {
                  uVar14 = 0;
                }
                pgVar10 = local_60 + w * (long)(int)local_78;
                for (uVar7 = 0; uVar7 != uVar14; uVar7 = uVar7 + 1) {
                  lVar12 = uVar7 + (long)(int)local_78;
                  if (-1 < lVar12) {
                    if (local_70 <= lVar12) break;
                    uVar5 = bm->w;
                    uVar9 = 0;
                    if (0 < (int)uVar5) {
                      uVar9 = (ulong)uVar5;
                    }
                    iVar2 = (int)uVar7 * uVar5;
                    lVar12 = (long)local_88;
                    while (bVar15 = uVar9 != 0, uVar9 = uVar9 - 1, bVar15) {
                      if (-1 < lVar12) {
                        if (local_a8 <= lVar12) break;
                        uVar5 = (uint)pgVar10[lVar12] + (uint)bm->b[iVar2];
                        gVar6 = (guint8)uVar5;
                        if (0xfe < uVar5) {
                          gVar6 = 0xff;
                        }
                        pgVar10[lVar12] = gVar6;
                      }
                      iVar2 = iVar2 + 1;
                      lVar12 = lVar12 + 1;
                    }
                  }
                  pgVar10 = pgVar10 + w;
                }
                g_free(bm->b);
                g_free(bm);
                FT_Done_Glyph(local_90);
                iVar2 = local_84;
              }
              else {
                FT_Done_Glyph();
              }
            }
            uVar14 = (ulong)(uint)(iVar13 + (int)((ulong)(local_68->advance).x >> 6));
            FT_Done_Glyph(local_58);
          }
        }
      }
    }
    FT_Done_FreeType(lib);
  }
  return;
}

Assistant:

void swap_drawstring(const char *str, guint8 *im, size_t w, size_t h) {
    size_t fs = ROUND_UPTO(h / 32, 4);
    size_t bd = CLAMP(h / 64, 8, 16);
    draw_string(P2SC_FONT_DROIDBOLD, CLAMP(fs, 20, 32), str, bd, h - 3 - bd, im, w, h);
}